

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator02buggy.cpp
# Opt level: O0

double factorial(double d)

{
  int local_58;
  int j;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  double dStack_18;
  int32_t i;
  double d_local;
  
  local_1c = (int)d;
  if (((double)local_1c != d) || (NAN((double)local_1c) || NAN(d))) {
    dStack_18 = d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"\'!\' could be used only on integers",&local_41);
    error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  local_58 = local_1c;
  if (local_1c == 0) {
    d_local = 1.0;
  }
  else {
    while (local_58 = local_58 + -1, 1 < local_58) {
      local_1c = local_58 * local_1c;
    }
    d_local = (double)local_1c;
  }
  return d_local;
}

Assistant:

double factorial(double d)
{
	auto i = static_cast<int32_t>(d);
	if (i != d)
		error("'!' could be used only on integers");
	if (i == 0)
		return 1.0; // factorial of 0 is 1
	for (auto j = (i - 1); j > 1; --j)
		i *= j;
	return static_cast<double>(i);
}